

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O2

WJTL_STATUS TestUnmarshallPartialFills(void)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  _Bool _Var5;
  size_t sVar6;
  JL_STATUS JVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  WJTL_STATUS WVar11;
  char *pcVar12;
  _Bool _Var13;
  long local_708;
  size_t errorAtPos;
  size_t local_6f8;
  int local_6ec;
  uint64_t local_6e8;
  size_t local_6e0;
  TheStruct theStruct;
  JlMarshallElement local_5d8;
  undefined8 local_578;
  char *pcStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined4 local_518;
  char *local_510;
  undefined1 local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined4 local_4d0;
  undefined2 local_4cc;
  undefined8 local_4c8;
  undefined4 local_4c0;
  undefined4 local_4b8;
  char *local_4b0;
  undefined1 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined6 uStack_478;
  undefined2 uStack_472;
  undefined6 uStack_470;
  undefined8 local_468;
  undefined4 local_460;
  undefined4 local_458;
  char *local_450;
  undefined1 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined6 uStack_418;
  undefined2 uStack_412;
  undefined6 uStack_410;
  undefined8 local_408;
  undefined4 local_400;
  JL_DATA_TYPE local_3f8;
  char *local_3f0;
  undefined1 local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined4 local_3b0;
  undefined2 local_3ac;
  undefined8 local_3a8;
  undefined4 local_3a0;
  JL_DATA_TYPE local_398;
  char *local_390;
  undefined1 local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined4 local_350;
  undefined2 local_34c;
  undefined8 local_348;
  undefined4 local_340;
  undefined4 local_338;
  char *local_330;
  undefined1 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined2 local_2ec;
  undefined8 local_2e8;
  undefined4 local_2e0;
  undefined4 local_2d8;
  char *local_2d0;
  undefined1 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  undefined2 local_28c;
  undefined8 local_288;
  undefined4 local_280;
  undefined4 local_278;
  char *local_270;
  undefined1 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined4 local_230;
  undefined2 local_22c;
  undefined8 local_228;
  undefined4 local_220;
  undefined4 local_218;
  char *local_210;
  undefined1 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined2 local_1cc;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined4 local_1b8;
  char *local_1b0;
  undefined1 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined4 local_170;
  undefined2 local_16c;
  JlMarshallElement *local_168;
  undefined4 local_160;
  undefined4 local_158;
  char *local_150;
  undefined1 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined4 local_110;
  undefined2 local_10c;
  JlMarshallElement *local_108;
  undefined4 local_100;
  JlMarshallElement marshalMiniStruct [2];
  
  errorAtPos = 0;
  memcpy(marshalMiniStruct,&DAT_001416b0,0xc0);
  local_5d8.Type = JL_DATA_TYPE_STRING;
  local_5d8.Name = "FixStr";
  local_5d8.IsArray = false;
  local_5d8.FieldOffset = 0;
  local_5d8.FieldSize = 10;
  local_5d8.ChildStructDescription = (JlMarshallElement *)0x0;
  local_5d8.ChildStructDescriptionCount = 0;
  local_568 = 0;
  local_558 = 0;
  uStack_550 = 0;
  local_548 = 0;
  uStack_540 = 0;
  local_538 = 0;
  uStack_530 = 0;
  local_528 = 0;
  uStack_520 = 0;
  local_5d8.CountFieldOffset = 0;
  local_5d8.CountFieldSize = 0;
  local_5d8.ArrayFieldSize = 0;
  local_5d8.ArrayItemSize._0_6_ = 0;
  local_5d8.ArrayItemSize._6_2_ = 0;
  local_5d8.NumberType = JL_NUM_TYPE_NONE;
  local_5d8.IsHex = false;
  local_5d8.IsBase64 = false;
  local_578 = 1;
  pcStack_570 = "VarStr";
  uStack_560 = 0x10;
  local_518 = 2;
  local_510 = "Num";
  local_508 = 0;
  local_500 = 0x18;
  local_4f8 = 4;
  local_4e0 = 0;
  uStack_4d8 = 0;
  local_4f0 = 0;
  uStack_4e8 = 0;
  local_4d0 = 10;
  local_4cc = 0;
  local_4c8 = 0;
  local_4c0 = 0;
  local_4b8 = 3;
  local_4b0 = "Bool1";
  local_4a8 = 0;
  local_4a0 = 0x1c;
  local_498 = 1;
  local_468 = 0;
  local_460 = 0;
  local_480 = 0;
  uStack_478 = 0;
  local_490 = 0;
  uStack_488 = 0;
  uStack_472 = 0;
  uStack_470 = 0;
  local_450 = "Bool2";
  local_708 = 0;
  local_448 = 0;
  local_440 = 0x1d;
  local_438 = 1;
  local_408 = 0;
  local_400 = 0;
  local_420 = 0;
  uStack_418 = 0;
  uStack_412 = 0;
  uStack_410 = 0;
  local_430 = 0;
  uStack_428 = 0;
  local_3f0 = "StrVarList";
  local_3e8 = 1;
  local_3e0 = 0x20;
  local_3d8 = 0;
  local_3d0 = 0x28;
  local_3c8 = 8;
  local_3c0 = 0;
  local_3b8 = 8;
  local_3b0 = 0;
  local_3ac = 0;
  local_3a8 = 0;
  local_3a0 = 0;
  local_390 = "StrFixList";
  local_388 = 1;
  local_380 = 0x30;
  local_378 = 0;
  local_370 = 0x50;
  local_368 = 8;
  local_360 = 0x20;
  local_358 = 8;
  local_350 = 0;
  local_34c = 0;
  local_348 = 0;
  local_340 = 0;
  local_330 = "NumVarList";
  local_328 = 1;
  local_320 = 0x58;
  local_318 = 4;
  local_310 = 0x60;
  local_308 = 8;
  local_300 = 0;
  local_2f8 = 4;
  local_2ec = 0;
  local_2e8 = 0;
  local_2e0 = 0;
  local_2d0 = "NumFixList";
  local_2c8 = 1;
  local_2c0 = 0x68;
  local_2b8 = 4;
  local_2b0 = 0x78;
  local_2a8 = 8;
  local_2a0 = 0x10;
  local_298 = 4;
  local_28c = 0;
  local_288 = 0;
  local_280 = 0;
  local_270 = "BoolVarList";
  local_268 = 1;
  local_260 = 0x80;
  local_258 = 1;
  local_250 = 0x88;
  local_248 = 8;
  local_240 = 0;
  local_238 = 1;
  local_230 = 0;
  local_22c = 0;
  local_228 = 0;
  local_220 = 0;
  local_210 = "BoolFixList";
  local_208 = 1;
  local_200 = 0x90;
  local_1f8 = 1;
  local_1f0 = 0x98;
  local_1e8 = 8;
  local_1e0 = 4;
  local_1d8 = 1;
  local_1d0 = 0;
  local_1cc = 0;
  local_1c8 = 0;
  local_1c0 = 0;
  local_1b8 = 5;
  local_1b0 = "MiniVarList";
  local_1a8 = 1;
  local_1a0 = 0xa0;
  local_198 = 8;
  local_190 = 0xa8;
  local_188 = 8;
  local_180 = 0;
  local_178 = 0x10;
  local_170 = 0;
  local_16c = 0;
  local_150 = "MiniFixList";
  local_148 = 1;
  local_140 = 0xb0;
  local_138 = 0x40;
  local_130 = 0xf0;
  local_128 = 8;
  local_120 = 0x40;
  local_118 = 0x10;
  local_110 = 0;
  local_10c = 0;
  WVar11 = WJTL_STATUS_SUCCESS;
  local_458 = local_4b8;
  local_3f8 = local_5d8.Type;
  local_398 = local_5d8.Type;
  local_338 = local_518;
  local_2f0 = local_4d0;
  local_2d8 = local_518;
  local_290 = local_4d0;
  local_278 = local_4b8;
  local_218 = local_4b8;
  local_168 = marshalMiniStruct;
  local_160 = local_518;
  local_158 = local_1b8;
  local_108 = marshalMiniStruct;
  local_100 = local_518;
  do {
    if (local_708 == 0xc) {
      return WVar11;
    }
    memset(&theStruct,0,0xf8);
    JVar7 = JlJsonToStruct("{ \"FixStr\":\"FixStr\", \"VarStr\":\"VarStr\", \"Num\":1234, \"Bool1\":true, \"Bool2\":false, \"StrVarList\":[\"StrVarList1\",\"StrVarList2\"], \"StrFixList\":[\"StrFixList1\",\"StrFixList2\"], \"NumVarList\":[101,102], \"NumFixList\":[201,202], \"BoolVarList\":[true,false,true], \"BoolFixList\":[true,false,true], \"MiniVarList\": [ {\"XNum\":301,\"XStr\":\"301\"}, {\"XNum\":401,\"XStr\":\"401\"} ], \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"} ] }"
                           ,&local_5d8,0xd,&theStruct,&errorAtPos);
    WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlJsonToStruct( \"{ \\\"FixStr\\\":\\\"FixStr\\\", \\\"VarStr\\\":\\\"VarStr\\\", \\\"Num\\\":1234, \\\"Bool1\\\":true, \\\"Bool2\\\":false,\" \" \\\"StrVarList\\\":[\\\"StrVarList1\\\",\\\"StrVarList2\\\"], \\\"StrFixList\\\":[\\\"StrFixList1\\\",\\\"StrFixList2\\\"],\" \" \\\"NumVarList\\\":[101,102], \\\"NumFixList\\\":[201,202], \\\"BoolVarList\\\":[true,false,true],\" \" \\\"BoolFixList\\\":[true,false,true],\" \" \\\"MiniVarList\\\": [ {\\\"XNum\\\":301,\\\"XStr\\\":\\\"301\\\"}, {\\\"XNum\\\":401,\\\"XStr\\\":\\\"401\\\"} ],\" \" \\\"MiniFixList\\\": [ {\\\"XNum\\\":501,\\\"XStr\\\":\\\"501\\\"}, {\\\"XNum\\\":601,\\\"XStr\\\":\\\"601\\\"} ] }\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                     ,"TestUnmarshallPartialFills",0x486);
    if (errorAtPos != 0) {
      WVar11 = WJTL_STATUS_FAILED;
    }
    if (JVar7 != JL_STATUS_SUCCESS) {
      WVar11 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(errorAtPos == 0,"0 == errorAtPos",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                     ,"TestUnmarshallPartialFills",0x487);
    switch(local_708) {
    case 0:
      JVar7 = JlJsonToStruct("{\"FixStr\":\"XXXX\"}",&local_5d8,0xd,&theStruct,&errorAtPos);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"FixStr\\\":\\\"XXXX\\\"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x48c);
      iVar9 = bcmp(&theStruct,"XXXX",5);
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.FixStr, \"XXXX\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x48d);
      if (iVar9 != 0 || JVar7 != JL_STATUS_SUCCESS) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      goto LAB_00113872;
    case 1:
      JVar7 = JlJsonToStruct("{\"VarStr\":\"XXXX\"}",&local_5d8,0xd,&theStruct,&errorAtPos);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"VarStr\\\":\\\"XXXX\\\"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x490);
      iVar9 = strcmp(theStruct.VarStr,"XXXX");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.VarStr, \"XXXX\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x491);
      if (iVar9 != 0 || JVar7 != JL_STATUS_SUCCESS) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      goto LAB_00113833;
    case 2:
      JVar7 = JlJsonToStruct("{\"Num\":9999}",&local_5d8,0xd,&theStruct,&errorAtPos);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"Num\\\":9999}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x494);
      _Var13 = theStruct.Num == 9999;
      if (!_Var13) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (JVar7 != JL_STATUS_SUCCESS) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      pcVar12 = "9999 == theStruct.Num";
      iVar9 = 0x495;
      break;
    case 3:
      JVar7 = JlJsonToStruct("{\"Bool1\":false,\"Bool2\":true}",&local_5d8,0xd,&theStruct,
                             &errorAtPos);
      if (JVar7 != JL_STATUS_SUCCESS) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"Bool1\\\":false,\\\"Bool2\\\":true}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x498);
      _Var13 = theStruct.Bool1;
      WjTestLib_Assert((_Bool)(theStruct.Bool1 ^ 1),"!theStruct.Bool1",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x499);
      if (_Var13 != false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      pcVar12 = "theStruct.Bool2";
      iVar9 = 0x49a;
      _Var13 = theStruct.Bool2;
      goto LAB_001137f9;
    case 4:
      JVar7 = JlJsonToStruct("{\"StrVarList\":[\"a\",\"b\",\"c\"]}",&local_5d8,0xd,&theStruct,
                             &errorAtPos);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"StrVarList\\\":[\\\"a\\\",\\\"b\\\",\\\"c\\\"]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x49d);
      sVar6 = theStruct.StrArrayCount;
      WjTestLib_Assert(theStruct.StrArrayCount == 3,"3 == theStruct.StrArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x49e);
      iVar9 = strcmp(*theStruct.StrArray,"a");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StrArray[0], \"a\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x49f);
      iVar10 = strcmp(theStruct.StrArray[1],"b");
      WjTestLib_Assert(iVar10 == 0,"strcmp( theStruct.StrArray[1], \"b\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a0);
      iVar8 = strcmp(theStruct.StrArray[2],"c");
      if (((iVar9 != 0 || JVar7 != JL_STATUS_SUCCESS) || iVar10 != 0) || iVar8 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (sVar6 != 3) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      _Var13 = iVar8 == 0;
      pcVar12 = "strcmp( theStruct.StrArray[2], \"c\" ) == 0";
      iVar9 = 0x4a1;
      break;
    case 5:
      JVar7 = JlJsonToStruct("{\"StrFixList\":[\"a\",\"b\",\"c\"]}",&local_5d8,0xd,&theStruct,
                             &errorAtPos);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"StrFixList\\\":[\\\"a\\\",\\\"b\\\",\\\"c\\\"]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a4);
      sVar6 = theStruct.StrFixArrayCount;
      WjTestLib_Assert(theStruct.StrFixArrayCount == 3,"3 == theStruct.StrFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a5);
      iVar9 = strcmp(theStruct.StrFixArray[0],"a");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StrFixArray[0], \"a\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a6);
      iVar10 = strcmp(theStruct.StrFixArray[1],"b");
      WjTestLib_Assert(iVar10 == 0,"strcmp( theStruct.StrFixArray[1], \"b\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a7);
      iVar8 = strcmp(theStruct.StrFixArray[2],"c");
      if (((iVar9 != 0 || JVar7 != JL_STATUS_SUCCESS) || iVar10 != 0) || iVar8 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (sVar6 != 3) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      _Var13 = iVar8 == 0;
      pcVar12 = "strcmp( theStruct.StrFixArray[2], \"c\" ) == 0";
      iVar9 = 0x4a8;
      break;
    case 6:
      JVar7 = JlJsonToStruct("{\"NumVarList\":[10,20,30]}",&local_5d8,0xd,&theStruct,&errorAtPos);
      local_6f8 = CONCAT44(local_6f8._4_4_,JVar7);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"NumVarList\\\":[10,20,30]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ab);
      sVar6 = theStruct.NumVarArrayCount;
      WjTestLib_Assert(theStruct.NumVarArrayCount == 3,"3 == theStruct.NumVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ac);
      uVar2 = *theStruct.NumVarArray;
      WjTestLib_Assert(uVar2 == 10,"10 == theStruct.NumVarArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ad);
      uVar1 = theStruct.NumVarArray[1];
      WjTestLib_Assert(uVar1 == 0x14,"20 == theStruct.NumVarArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ae);
      _Var13 = theStruct.NumVarArray[2] == 0x1e;
      if (!_Var13) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar1 != 0x14) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar2 != 10) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (sVar6 != 3) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if ((int)local_6f8 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      pcVar12 = "30 == theStruct.NumVarArray[2]";
      iVar9 = 0x4af;
      break;
    case 7:
      JVar7 = JlJsonToStruct("{\"NumFixList\":[10,20,30]}",&local_5d8,0xd,&theStruct,&errorAtPos);
      local_6f8 = CONCAT44(local_6f8._4_4_,JVar7);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"NumFixList\\\":[10,20,30]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b2);
      sVar6 = theStruct.NumFixArrayCount;
      WjTestLib_Assert(theStruct.NumFixArrayCount == 3,"3 == theStruct.NumFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b3);
      uVar2 = theStruct.NumFixArray[0];
      WjTestLib_Assert(theStruct.NumFixArray[0] == 10,"10 == theStruct.NumFixArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b4);
      uVar1 = theStruct.NumFixArray[1];
      WjTestLib_Assert(theStruct.NumFixArray[1] == 0x14,"20 == theStruct.NumFixArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b5);
      _Var13 = theStruct.NumFixArray[2] == 0x1e;
      if (!_Var13) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar1 != 0x14) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar2 != 10) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (sVar6 != 3) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if ((int)local_6f8 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      pcVar12 = "30 == theStruct.NumFixArray[2]";
      iVar9 = 0x4b6;
      break;
    case 8:
      JVar7 = JlJsonToStruct("{\"BoolVarList\":[false,true,false,true]}",&local_5d8,0xd,&theStruct,
                             &errorAtPos);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"BoolVarList\\\":[false,true,false,true]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b9);
      if (theStruct.BoolVarArrayCount != 4) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (JVar7 != JL_STATUS_SUCCESS) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(theStruct.BoolVarArrayCount == 4,"4 == theStruct.BoolVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ba);
      _Var13 = *theStruct.BoolVarArray;
      WjTestLib_Assert((_Bool)(_Var13 ^ 1),"!theStruct.BoolVarArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4bb);
      if (_Var13 != false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      _Var13 = theStruct.BoolVarArray[1];
      WjTestLib_Assert(_Var13,"theStruct.BoolVarArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4bc);
      if (_Var13 == false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      _Var13 = theStruct.BoolVarArray[2];
      WjTestLib_Assert((_Bool)(_Var13 ^ 1),"!theStruct.BoolVarArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4bd);
      if (_Var13 != false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      _Var13 = theStruct.BoolVarArray[3];
      pcVar12 = "theStruct.BoolVarArray[3]";
      iVar9 = 0x4be;
      goto LAB_001137f9;
    case 9:
      JVar7 = JlJsonToStruct("{\"BoolFixList\":[false,true,false,true]}",&local_5d8,0xd,&theStruct,
                             &errorAtPos);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"BoolFixList\\\":[false,true,false,true]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c1);
      if (theStruct.BoolFixArrayCount != 4) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (JVar7 != JL_STATUS_SUCCESS) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(theStruct.BoolFixArrayCount == 4,"4 == theStruct.BoolFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c2);
      _Var13 = theStruct.BoolFixArray[0];
      WjTestLib_Assert((_Bool)(theStruct.BoolFixArray[0] ^ 1),"!theStruct.BoolFixArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c3);
      _Var5 = theStruct.BoolFixArray[1];
      if (_Var13 != false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(theStruct.BoolFixArray[1],"theStruct.BoolFixArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c4);
      _Var13 = theStruct.BoolFixArray[2];
      if (_Var5 == false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert((_Bool)(theStruct.BoolFixArray[2] ^ 1),"!theStruct.BoolFixArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c5);
      if (_Var13 != false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      pcVar12 = "theStruct.BoolFixArray[3]";
      iVar9 = 0x4c6;
      _Var13 = theStruct.BoolFixArray[3];
LAB_001137f9:
      WjTestLib_Assert(_Var13,pcVar12,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",iVar9);
      if (_Var13 == false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      goto LAB_00113833;
    case 10:
      JVar7 = JlJsonToStruct("{\"MiniVarList\": [ {\"XNum\":777,\"XStr\":\"777\"}, {\"XNum\":888,\"XStr\":\"888\"}, {\"XNum\":999,\"XStr\":\"999\"} ]}"
                             ,&local_5d8,0xd,&theStruct,&errorAtPos);
      local_6f8 = CONCAT44(local_6f8._4_4_,JVar7);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"MiniVarList\\\": [ {\\\"XNum\\\":777,\\\"XStr\\\":\\\"777\\\"}, {\\\"XNum\\\":888,\\\"XStr\\\":\\\"888\\\"}, {\\\"XNum\\\":999,\\\"XStr\\\":\\\"999\\\"} ]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c9);
      local_6e0 = theStruct.StructVarArrayCount;
      WjTestLib_Assert(theStruct.StructVarArrayCount == 3,"3 == theStruct.StructVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ca);
      local_6e8 = (theStruct.StructVarArray)->XNum;
      WjTestLib_Assert(local_6e8 == 0x309,"777 == theStruct.StructVarArray[0].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4cb);
      local_6ec = strcmp((theStruct.StructVarArray)->XStr,"777");
      WjTestLib_Assert(local_6ec == 0,"strcmp( theStruct.StructVarArray[0].XStr, \"777\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4cc);
      uVar3 = theStruct.StructVarArray[1].XNum;
      WjTestLib_Assert(uVar3 == 0x378,"888 == theStruct.StructVarArray[1].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4cd);
      iVar9 = strcmp(theStruct.StructVarArray[1].XStr,"888");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StructVarArray[1].XStr, \"888\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ce);
      uVar4 = theStruct.StructVarArray[2].XNum;
      WjTestLib_Assert(uVar4 == 999,"999 == theStruct.StructVarArray[2].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4cf);
      iVar10 = strcmp(theStruct.StructVarArray[2].XStr,"999");
      _Var13 = iVar10 == 0;
      if (!_Var13) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar4 != 999) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (iVar9 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar3 != 0x378) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (local_6ec != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (local_6e8 != 0x309) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (local_6e0 != 3) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if ((int)local_6f8 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      pcVar12 = "strcmp( theStruct.StructVarArray[2].XStr, \"999\" ) == 0";
      iVar9 = 0x4d0;
      break;
    case 0xb:
      JVar7 = JlJsonToStruct("{\"MiniFixList\": [ {\"XNum\":777,\"XStr\":\"777\"}, {\"XNum\":888,\"XStr\":\"888\"}, {\"XNum\":999,\"XStr\":\"999\"} ]}"
                             ,&local_5d8,0xd,&theStruct,&errorAtPos);
      local_6e0 = CONCAT44(local_6e0._4_4_,JVar7);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"MiniFixList\\\": [ {\\\"XNum\\\":777,\\\"XStr\\\":\\\"777\\\"}, {\\\"XNum\\\":888,\\\"XStr\\\":\\\"888\\\"}, {\\\"XNum\\\":999,\\\"XStr\\\":\\\"999\\\"} ]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d3);
      local_6f8 = theStruct.StructFixArrayCount;
      WjTestLib_Assert(theStruct.StructFixArrayCount == 3,"3 == theStruct.StructFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d4);
      local_6e8 = theStruct.StructFixArray[0].XNum;
      WjTestLib_Assert(theStruct.StructFixArray[0].XNum == 0x309,
                       "777 == theStruct.StructFixArray[0].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d5);
      local_6ec = strcmp(theStruct.StructFixArray[0].XStr,"777");
      WjTestLib_Assert(local_6ec == 0,"strcmp( theStruct.StructFixArray[0].XStr, \"777\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d6);
      uVar3 = theStruct.StructFixArray[1].XNum;
      WjTestLib_Assert(theStruct.StructFixArray[1].XNum == 0x378,
                       "888 == theStruct.StructFixArray[1].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d7);
      iVar9 = strcmp(theStruct.StructFixArray[1].XStr,"888");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StructFixArray[1].XStr, \"888\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d8);
      uVar4 = theStruct.StructFixArray[2].XNum;
      WjTestLib_Assert(theStruct.StructFixArray[2].XNum == 999,
                       "999 == theStruct.StructFixArray[2].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d9);
      iVar10 = strcmp(theStruct.StructFixArray[2].XStr,"999");
      _Var13 = iVar10 == 0;
      if (!_Var13) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar4 != 999) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (iVar9 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar3 != 0x378) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (local_6ec != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (local_6e8 != 0x309) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (local_6f8 != 3) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if ((int)local_6e0 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      pcVar12 = "strcmp( theStruct.StructFixArray[2].XStr, \"999\" ) == 0";
      iVar9 = 0x4da;
      break;
    default:
      WjTestLib_Assert(false,"false",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4dd);
      WVar11 = WJTL_STATUS_FAILED;
      goto LAB_00113833;
    }
    WjTestLib_Assert(_Var13,pcVar12,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                     ,"TestUnmarshallPartialFills",iVar9);
LAB_00113833:
    iVar9 = bcmp(&theStruct,"FixStr",7);
    if (iVar9 != 0) {
      WVar11 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.FixStr, \"FixStr\" ) == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                     ,"TestUnmarshallPartialFills",0x4e2);
    if (local_708 == 1) {
LAB_001138ae:
      if (theStruct.Num != 0x4d2) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(theStruct.Num == 0x4d2,"1234 == theStruct.Num",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4e4);
      if (local_708 != 3) goto LAB_001138df;
LAB_00113940:
      sVar6 = theStruct.StrArrayCount;
      WjTestLib_Assert(theStruct.StrArrayCount == 2,"2 == theStruct.StrArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ea);
      iVar9 = strcmp(*theStruct.StrArray,"StrVarList1");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StrArray[0], \"StrVarList1\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4eb);
      iVar10 = strcmp(theStruct.StrArray[1],"StrVarList2");
      if (iVar9 != 0 || iVar10 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (sVar6 != 2) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(iVar10 == 0,"strcmp( theStruct.StrArray[1], \"StrVarList2\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ec);
      if (local_708 != 5) goto LAB_001139f0;
LAB_00113a9c:
      sVar6 = theStruct.NumVarArrayCount;
      WjTestLib_Assert(theStruct.NumVarArrayCount == 2,"2 == theStruct.NumVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f4);
      uVar2 = *theStruct.NumVarArray;
      WjTestLib_Assert(uVar2 == 0x65,"101 == theStruct.NumVarArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f5);
      if (theStruct.NumVarArray[1] != 0x66) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar2 != 0x65) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (sVar6 != 2) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(theStruct.NumVarArray[1] == 0x66,"102 == theStruct.NumVarArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f6);
      if (local_708 != 7) goto LAB_00113b46;
LAB_00113bf2:
      sVar6 = theStruct.BoolVarArrayCount;
      WjTestLib_Assert(theStruct.BoolVarArrayCount == 3,"3 == theStruct.BoolVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4fe);
      if (*theStruct.BoolVarArray == false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (sVar6 != 3) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(*theStruct.BoolVarArray,"theStruct.BoolVarArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ff);
      _Var13 = theStruct.BoolVarArray[1];
      WjTestLib_Assert((_Bool)(_Var13 ^ 1),"!theStruct.BoolVarArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x500);
      if (_Var13 != false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      _Var13 = theStruct.BoolVarArray[2];
      WjTestLib_Assert(_Var13,"theStruct.BoolVarArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x501);
      if (_Var13 == false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (local_708 != 9) goto LAB_00113cbf;
LAB_00113d7f:
      sVar6 = theStruct.StructVarArrayCount;
      WjTestLib_Assert(theStruct.StructVarArrayCount == 2,"2 == theStruct.StructVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50a);
      uVar3 = (theStruct.StructVarArray)->XNum;
      WjTestLib_Assert(uVar3 == 0x12d,"301 == theStruct.StructVarArray[0].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50b);
      iVar9 = strcmp((theStruct.StructVarArray)->XStr,"301");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StructVarArray[0].XStr, \"301\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50c);
      uVar4 = theStruct.StructVarArray[1].XNum;
      WjTestLib_Assert(uVar4 == 0x191,"401 == theStruct.StructVarArray[1].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50d);
      iVar10 = strcmp(theStruct.StructVarArray[1].XStr,"401");
      if (iVar10 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar4 != 0x191) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (iVar9 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar3 != 0x12d) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (sVar6 != 2) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(iVar10 == 0,"strcmp( theStruct.StructVarArray[1].XStr, \"401\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50e);
      if (local_708 != 0xb) goto LAB_00113edc;
    }
    else {
LAB_00113872:
      iVar9 = strcmp(theStruct.VarStr,"VarStr");
      if (iVar9 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.VarStr, \"VarStr\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4e3);
      if (local_708 != 2) goto LAB_001138ae;
LAB_001138df:
      _Var13 = theStruct.Bool1;
      WjTestLib_Assert(theStruct.Bool1,"theStruct.Bool1",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4e6);
      _Var5 = theStruct.Bool2;
      if (_Var13 == false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert((_Bool)(theStruct.Bool2 ^ 1),"!theStruct.Bool2",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4e7);
      if (_Var5 != false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (local_708 != 4) goto LAB_00113940;
LAB_001139f0:
      sVar6 = theStruct.StrFixArrayCount;
      WjTestLib_Assert(theStruct.StrFixArrayCount == 2,"2 == theStruct.StrFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ef);
      iVar9 = strcmp(theStruct.StrFixArray[0],"StrFixList1");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StrFixArray[0], \"StrFixList1\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f0);
      iVar10 = strcmp(theStruct.StrFixArray[1],"StrFixList2");
      if (iVar9 != 0 || iVar10 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (sVar6 != 2) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(iVar10 == 0,"strcmp( theStruct.StrFixArray[1], \"StrFixList2\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f1);
      if (local_708 != 6) goto LAB_00113a9c;
LAB_00113b46:
      sVar6 = theStruct.NumFixArrayCount;
      WjTestLib_Assert(theStruct.NumFixArrayCount == 2,"2 == theStruct.NumFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f9);
      uVar2 = theStruct.NumFixArray[0];
      WjTestLib_Assert(theStruct.NumFixArray[0] == 0xc9,"201 == theStruct.NumFixArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4fa);
      if (theStruct.NumFixArray[1] != 0xca) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar2 != 0xc9) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (sVar6 != 2) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(theStruct.NumFixArray[1] == 0xca,"202 == theStruct.NumFixArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4fb);
      if (local_708 != 8) goto LAB_00113bf2;
LAB_00113cbf:
      sVar6 = theStruct.BoolFixArrayCount;
      WjTestLib_Assert(theStruct.BoolFixArrayCount == 3,"3 == theStruct.BoolFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x504);
      if (theStruct.BoolFixArray[0] == false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (sVar6 != 3) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(theStruct.BoolFixArray[0],"theStruct.BoolFixArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x505);
      _Var13 = theStruct.BoolFixArray[1];
      WjTestLib_Assert((_Bool)(theStruct.BoolFixArray[1] ^ 1),"!theStruct.BoolFixArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x506);
      _Var5 = theStruct.BoolFixArray[2];
      if (_Var13 != false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(theStruct.BoolFixArray[2],"theStruct.BoolFixArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x507);
      if (_Var5 == false) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (local_708 != 10) goto LAB_00113d7f;
LAB_00113edc:
      sVar6 = theStruct.StructFixArrayCount;
      WjTestLib_Assert(theStruct.StructFixArrayCount == 2,"2 == theStruct.StructFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x511);
      uVar3 = theStruct.StructFixArray[0].XNum;
      WjTestLib_Assert(theStruct.StructFixArray[0].XNum == 0x1f5,
                       "501 == theStruct.StructFixArray[0].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x512);
      iVar9 = strcmp(theStruct.StructFixArray[0].XStr,"501");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StructFixArray[0].XStr, \"501\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x513);
      uVar4 = theStruct.StructFixArray[1].XNum;
      WjTestLib_Assert(theStruct.StructFixArray[1].XNum == 0x259,
                       "601 == theStruct.StructFixArray[1].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x514);
      iVar10 = strcmp(theStruct.StructFixArray[1].XStr,"601");
      if (iVar10 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar4 != 0x259) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (iVar9 != 0) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (uVar3 != 0x1f5) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      if (sVar6 != 2) {
        WVar11 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(iVar10 == 0,"strcmp( theStruct.StructFixArray[1].XStr, \"601\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x515);
    }
    JVar7 = JlUnmarshallFreeStructAllocs(&local_5d8,0xd,&theStruct);
    if (JVar7 != JL_STATUS_SUCCESS) {
      WVar11 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                     ,"TestUnmarshallPartialFills",0x518);
    local_708 = local_708 + 1;
  } while( true );
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallPartialFills
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        uint64_t    XNum;
        char*       XStr;
    } MiniStruct;

    typedef struct
    {
        char        FixStr[10];
        char*       VarStr;
        uint32_t    Num;
        bool        Bool1;
        bool        Bool2;
        char**      StrArray;
        size_t      StrArrayCount;
        char*       StrFixArray[4];
        size_t      StrFixArrayCount;
        uint32_t*   NumVarArray;
        size_t      NumVarArrayCount;
        uint32_t    NumFixArray[4];
        size_t      NumFixArrayCount;
        bool*       BoolVarArray;
        size_t      BoolVarArrayCount;
        bool        BoolFixArray[4];
        size_t      BoolFixArrayCount;
        MiniStruct* StructVarArray;
        size_t      StructVarArrayCount;
        MiniStruct  StructFixArray[4];
        size_t      StructFixArrayCount;
    } TheStruct;

    JlMarshallElement marshalMiniStruct[] = {
        JlMarshallUnsigned( MiniStruct, XNum, "XNum" ),
        JlMarshallString( MiniStruct, XStr, "XStr" ),
    };

    JlMarshallElement marshalTheStruct[] = {
        JlMarshallStringFixed( TheStruct, FixStr, "FixStr" ),
        JlMarshallString( TheStruct, VarStr, "VarStr" ),
        JlMarshallUnsigned( TheStruct, Num, "Num" ),
        JlMarshallBool( TheStruct, Bool1, "Bool1" ),
        JlMarshallBool( TheStruct, Bool2, "Bool2" ),
        JlMarshallStringArray( TheStruct, StrArray, StrArrayCount, "StrVarList" ),
        JlMarshallStringFixedArray( TheStruct, StrFixArray, StrFixArrayCount, "StrFixList" ),
        JlMarshallUnsignedArray( TheStruct, NumVarArray, NumVarArrayCount, "NumVarList" ),
        JlMarshallUnsignedFixedArray( TheStruct, NumFixArray, NumFixArrayCount, "NumFixList" ),
        JlMarshallBoolArray( TheStruct, BoolVarArray, BoolVarArrayCount, "BoolVarList" ),
        JlMarshallBoolFixedArray( TheStruct, BoolFixArray, BoolFixArrayCount, "BoolFixList" ),
        JlMarshallStructArray( TheStruct, StructVarArray, StructVarArrayCount, "MiniVarList", MiniStruct, marshalMiniStruct, NumElements(marshalMiniStruct) ),
        JlMarshallStructFixedArray( TheStruct, StructFixArray, StructFixArrayCount, "MiniFixList", MiniStruct, marshalMiniStruct, NumElements(marshalMiniStruct) ),
    };

    // Test replacing each element individually with new json and verify rest of struct does not get changed
    for( size_t element=1; element<=12; element++ )
    {
        TheStruct theStruct = {{0}};

        // Fill in struct with values
        JL_ASSERT_SUCCESS( JlJsonToStruct(
            "{ \"FixStr\":\"FixStr\", \"VarStr\":\"VarStr\", \"Num\":1234, \"Bool1\":true, \"Bool2\":false,"
            " \"StrVarList\":[\"StrVarList1\",\"StrVarList2\"], \"StrFixList\":[\"StrFixList1\",\"StrFixList2\"],"
            " \"NumVarList\":[101,102], \"NumFixList\":[201,202], \"BoolVarList\":[true,false,true],"
            " \"BoolFixList\":[true,false,true],"
            " \"MiniVarList\": [ {\"XNum\":301,\"XStr\":\"301\"}, {\"XNum\":401,\"XStr\":\"401\"} ],"
            " \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"} ] }",
             marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
        JL_ASSERT( 0 == errorAtPos );

        switch( element )
        {
        case 1:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"FixStr\":\"XXXX\"}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( strcmp( theStruct.FixStr, "XXXX" ) == 0 );
            break;
        case 2:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"VarStr\":\"XXXX\"}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( strcmp( theStruct.VarStr, "XXXX" ) == 0 );
            break;
        case 3:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"Num\":9999}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 9999 == theStruct.Num );
            break;
        case 4:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"Bool1\":false,\"Bool2\":true}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( !theStruct.Bool1 );
            JL_ASSERT( theStruct.Bool2 );
            break;
        case 5:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"StrVarList\":[\"a\",\"b\",\"c\"]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.StrArrayCount );
            JL_ASSERT( strcmp( theStruct.StrArray[0], "a" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrArray[1], "b" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrArray[2], "c" ) == 0 );
            break;
        case 6:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"StrFixList\":[\"a\",\"b\",\"c\"]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.StrFixArrayCount );
            JL_ASSERT( strcmp( theStruct.StrFixArray[0], "a" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrFixArray[1], "b" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrFixArray[2], "c" ) == 0 );
            break;
        case 7:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"NumVarList\":[10,20,30]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.NumVarArrayCount );
            JL_ASSERT( 10 == theStruct.NumVarArray[0] );
            JL_ASSERT( 20 == theStruct.NumVarArray[1] );
            JL_ASSERT( 30 == theStruct.NumVarArray[2] );
            break;
        case 8:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"NumFixList\":[10,20,30]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.NumFixArrayCount );
            JL_ASSERT( 10 == theStruct.NumFixArray[0] );
            JL_ASSERT( 20 == theStruct.NumFixArray[1] );
            JL_ASSERT( 30 == theStruct.NumFixArray[2] );
            break;
        case 9:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"BoolVarList\":[false,true,false,true]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 4 == theStruct.BoolVarArrayCount );
            JL_ASSERT( !theStruct.BoolVarArray[0] );
            JL_ASSERT( theStruct.BoolVarArray[1] );
            JL_ASSERT( !theStruct.BoolVarArray[2] );
            JL_ASSERT( theStruct.BoolVarArray[3] );
            break;
        case 10:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"BoolFixList\":[false,true,false,true]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 4 == theStruct.BoolFixArrayCount );
            JL_ASSERT( !theStruct.BoolFixArray[0] );
            JL_ASSERT( theStruct.BoolFixArray[1] );
            JL_ASSERT( !theStruct.BoolFixArray[2] );
            JL_ASSERT( theStruct.BoolFixArray[3] );
            break;
        case 11:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"MiniVarList\": [ {\"XNum\":777,\"XStr\":\"777\"}, {\"XNum\":888,\"XStr\":\"888\"}, {\"XNum\":999,\"XStr\":\"999\"} ]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.StructVarArrayCount );
            JL_ASSERT( 777 == theStruct.StructVarArray[0].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[0].XStr, "777" ) == 0 );
            JL_ASSERT( 888 == theStruct.StructVarArray[1].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[1].XStr, "888" ) == 0 );
            JL_ASSERT( 999 == theStruct.StructVarArray[2].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[2].XStr, "999" ) == 0 );
            break;
        case 12:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"MiniFixList\": [ {\"XNum\":777,\"XStr\":\"777\"}, {\"XNum\":888,\"XStr\":\"888\"}, {\"XNum\":999,\"XStr\":\"999\"} ]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.StructFixArrayCount );
            JL_ASSERT( 777 == theStruct.StructFixArray[0].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[0].XStr, "777" ) == 0 );
            JL_ASSERT( 888 == theStruct.StructFixArray[1].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[1].XStr, "888" ) == 0 );
            JL_ASSERT( 999 == theStruct.StructFixArray[2].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[2].XStr, "999" ) == 0 );
            break;
        default:
            JL_ASSERT( false );
            break;
        }

        // Verify every other element is still there
        if( 1 != element ) { JL_ASSERT( strcmp( theStruct.FixStr, "FixStr" ) == 0 ); }
        if( 2 != element ) { JL_ASSERT( strcmp( theStruct.VarStr, "VarStr" ) == 0 ); }
        if( 3 != element ) { JL_ASSERT( 1234 == theStruct.Num ); }
        if( 4 != element ) {
            JL_ASSERT( theStruct.Bool1 );
            JL_ASSERT( !theStruct.Bool2 );
        }
        if( 5 != element ) {
            JL_ASSERT( 2 == theStruct.StrArrayCount );
            JL_ASSERT( strcmp( theStruct.StrArray[0], "StrVarList1" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrArray[1], "StrVarList2" ) == 0 );
        }
        if( 6 != element ) {
            JL_ASSERT( 2 == theStruct.StrFixArrayCount );
            JL_ASSERT( strcmp( theStruct.StrFixArray[0], "StrFixList1" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrFixArray[1], "StrFixList2" ) == 0 );
        }
        if( 7 != element ) {
            JL_ASSERT( 2 == theStruct.NumVarArrayCount );
            JL_ASSERT( 101 == theStruct.NumVarArray[0] );
            JL_ASSERT( 102 == theStruct.NumVarArray[1] );
        }
        if( 8 != element ) {
            JL_ASSERT( 2 == theStruct.NumFixArrayCount );
            JL_ASSERT( 201 == theStruct.NumFixArray[0] );
            JL_ASSERT( 202 == theStruct.NumFixArray[1] );
        }
        if( 9 != element ) {
            JL_ASSERT( 3 == theStruct.BoolVarArrayCount );
            JL_ASSERT( theStruct.BoolVarArray[0] );
            JL_ASSERT( !theStruct.BoolVarArray[1] );
            JL_ASSERT( theStruct.BoolVarArray[2] );
        }
        if( 10 != element ) {
            JL_ASSERT( 3 == theStruct.BoolFixArrayCount );
            JL_ASSERT( theStruct.BoolFixArray[0] );
            JL_ASSERT( !theStruct.BoolFixArray[1] );
            JL_ASSERT( theStruct.BoolFixArray[2] );
        }
        if( 11 != element ) {
            JL_ASSERT( 2 == theStruct.StructVarArrayCount );
            JL_ASSERT( 301 == theStruct.StructVarArray[0].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[0].XStr, "301" ) == 0 );
            JL_ASSERT( 401 == theStruct.StructVarArray[1].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[1].XStr, "401" ) == 0 );
        }
        if( 12 != element ) {
            JL_ASSERT( 2 == theStruct.StructFixArrayCount );
            JL_ASSERT( 501 == theStruct.StructFixArray[0].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[0].XStr, "501" ) == 0 );
            JL_ASSERT( 601 == theStruct.StructFixArray[1].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[1].XStr, "601" ) == 0 );
        }

        JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTheStruct, NumElements(marshalTheStruct), &theStruct ) );
    }

    return TestReturn;
}